

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

bool amrex::AmrLevel::isStateVariable(string *name,int *typ,int *n)

{
  __type _Var1;
  int iVar2;
  StateDescriptor *this;
  int *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  StateDescriptor *desc;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int iVar3;
  
  *(int *)in_RSI = 0;
  do {
    iVar3 = *(int *)in_RSI;
    iVar2 = DescriptorList::size((DescriptorList *)0x1396b25);
    if (iVar2 <= iVar3) {
      return false;
    }
    this = DescriptorList::operator[]
                     ((DescriptorList *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
    *in_RDX = 0;
    while( true ) {
      in_stack_ffffffffffffffd0 = *in_RDX;
      iVar2 = StateDescriptor::nComp(this);
      if (iVar2 <= in_stack_ffffffffffffffd0) break;
      StateDescriptor::name_abi_cxx11_
                ((StateDescriptor *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      _Var1 = std::operator==(in_RDI,in_RSI);
      if (_Var1) {
        return true;
      }
      *in_RDX = *in_RDX + 1;
    }
    *(int *)in_RSI = *(int *)in_RSI + 1;
  } while( true );
}

Assistant:

bool
AmrLevel::isStateVariable (const std::string& name, int& typ, int& n)
{
    for (typ = 0; typ < desc_lst.size(); typ++)
    {
        const StateDescriptor& desc = desc_lst[typ];

        for (n = 0; n < desc.nComp(); n++)
        {
            if (desc.name(n) == name)
                return true;
        }
    }
    return false;
}